

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::WFXMLScanner::scanStartTag(WFXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLCh XVar1;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *pRVar2;
  BaseRefVectorOf<xercesc_4_0::XMLElementDecl> *this_01;
  XMLReader *this_02;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_03;
  ValueVectorOf<unsigned_long> *this_04;
  XMLDocumentHandler *pXVar3;
  bool bVar4;
  XMLCh XVar5;
  ulong uVar6;
  DTDElementDecl *this_05;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  unsigned_long *puVar9;
  XMLAttr *pXVar10;
  UnexpectedEOFException *this_06;
  XMLByte *pXVar11;
  ulong uVar12;
  XMLCh *pXVar13;
  XMLSize_t k;
  RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *pRVar14;
  XMLSize_t XVar15;
  XMLBuffer *toFill;
  int iVar16;
  bool bFoundSpace;
  XMLCh *local_80;
  XMLBuffer *local_78;
  ulong local_70;
  XMLSize_t attNameHash;
  DTDElementDecl *local_60;
  bool *local_58;
  ElemStack *local_50;
  XMLSize_t local_48;
  XMLSize_t local_40;
  XMLBuffer *local_38;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar4 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,
                             &(this->super_XMLScanner).fQNameBuf,false);
  if (bVar4) {
    local_48 = (this->super_XMLScanner).fElemStack.fStackTop;
    pXVar8 = (this->super_XMLScanner).fQNameBuf.fBuffer;
    pXVar8[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
    pRVar2 = this->fElementLookup;
    if ((pXVar8 == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*pXVar8, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      XVar5 = pXVar8[1];
      if (XVar5 != L'\0') {
        pXVar7 = pXVar8 + 2;
        do {
          uVar6 = (ulong)(ushort)XVar5 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar5 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar5 != L'\0');
      }
      uVar6 = uVar6 % pRVar2->fHashModulus;
    }
    pRVar14 = pRVar2->fBucketList[uVar6];
    if (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *)0x0) {
      do {
        bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,pXVar8,pRVar14->fKey);
        if (bVar4) goto LAB_002c16ce;
        pRVar14 = pRVar14->fNext;
      } while (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *)0x0);
    }
    pRVar14 = (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *)0x0;
LAB_002c16ce:
    if (pRVar14 == (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *)0x0) {
      this_05 = (DTDElementDecl *)0x0;
    }
    else {
      this_05 = (DTDElementDecl *)pRVar14->fData;
    }
    if (this_05 == (DTDElementDecl *)0x0) {
      if ((ulong)this->fElementIndex <
          (this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fCurCount) {
        this_05 = (DTDElementDecl *)
                  BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::elementAt
                            (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>,
                             (ulong)this->fElementIndex);
      }
      else {
        this_05 = (DTDElementDecl *)
                  XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
        DTDElementDecl::DTDElementDecl(this_05,(this->super_XMLScanner).fGrammarPoolMemoryManager);
        this_01 = &this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>;
        BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::ensureExtraCapacity(this_01,1);
        XVar15 = this_01->fCurCount;
        this_01->fElemList[XVar15] = (XMLElementDecl *)this_05;
        this_01->fCurCount = XVar15 + 1;
      }
      XMLElementDecl::setElementName
                (&this_05->super_XMLElementDecl,L"",pXVar8,
                 (this->super_XMLScanner).fEmptyNamespaceId);
      pRVar2 = this->fElementLookup;
      pXVar7 = QName::getRawName((this_05->super_XMLElementDecl).fElementName);
      RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::put
                (pRVar2,pXVar7,&this_05->super_XMLElementDecl);
      this->fElementIndex = this->fElementIndex + 1;
    }
    local_50 = &(this->super_XMLScanner).fElemStack;
    local_80 = pXVar8;
    local_60 = this_05;
    local_58 = gotData;
    ElemStack::addLevel(local_50,&this_05->super_XMLElementDecl,
                        ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
    ReaderMgr::skipPastSpaces(this_00);
    local_40 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
               fCurCount;
    toFill = &(this->super_XMLScanner).fAttNameBuf;
    local_38 = &(this->super_XMLScanner).fAttValueBuf;
    uVar6 = 0;
    local_70 = 0;
    local_78 = toFill;
    do {
      XVar5 = ReaderMgr::peekNextChar(this_00);
      if (((uVar6 != 0) && (XVar5 != L'/')) && (XVar5 != L'>')) {
        ReaderMgr::skipPastSpaces(this_00,&bFoundSpace,false);
        if (bFoundSpace == false) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
        }
        XVar5 = ReaderMgr::peekNextChar(this_00);
      }
      this_02 = (this->super_XMLScanner).fReaderMgr.fCurReader;
      pXVar11 = this_02->fgCharCharsTable;
      if ((pXVar11[(ushort)XVar5] & 0x10) == 0) {
        toFill->fIndex = 0;
        bVar4 = XMLReader::getName(this_02,toFill,false);
        if (!bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
          do {
            XVar5 = ReaderMgr::getNextChar(this_00);
            if (XVar5 == L'\0') break;
          } while (XVar5 != L'>');
          iVar16 = 1;
          goto LAB_002c1d39;
        }
        bVar4 = XMLScanner::scanEq(&this->super_XMLScanner,false);
        if (!bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
          XVar5 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
          if ((ushort)XVar5 < 0x2f) {
            if ((XVar5 != L'\"') && (XVar5 != L'\'')) {
LAB_002c19ea:
              if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                             [(ushort)XVar5]) {
                iVar16 = 1;
                if (XVar5 == L'<') {
                  XMLScanner::emitError
                            (&this->super_XMLScanner,UnterminatedStartTag,local_80,(XMLCh *)0x0,
                             (XMLCh *)0x0,(XMLCh *)0x0);
                  bVar4 = false;
                }
                else {
                  bVar4 = false;
                }
                goto LAB_002c1a33;
              }
            }
            iVar16 = 0;
            bVar4 = true;
          }
          else {
            iVar16 = 2;
            bVar4 = false;
            if ((XVar5 != L'/') && (bVar4 = false, XVar5 != L'>')) goto LAB_002c19ea;
          }
LAB_002c1a33:
          if (!bVar4) goto LAB_002c1d39;
        }
        pXVar8 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar8[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        if ((pXVar8 == (XMLCh *)0x0) || (uVar12 = (ulong)(ushort)*pXVar8, uVar12 == 0)) {
          attNameHash = 0;
        }
        else {
          XVar5 = pXVar8[1];
          if (XVar5 != L'\0') {
            pXVar7 = pXVar8 + 2;
            do {
              uVar12 = (ulong)(ushort)XVar5 + (uVar12 >> 0x18) + uVar12 * 0x26;
              XVar5 = *pXVar7;
              pXVar7 = pXVar7 + 1;
            } while (XVar5 != L'\0');
          }
          attNameHash = uVar12 % 0x6d;
        }
        if (uVar6 != 0) {
          XVar15 = 0;
          do {
            puVar9 = ValueVectorOf<unsigned_long>::elementAt(this->fAttrNameHashList,XVar15);
            if (*puVar9 == attNameHash) {
              pXVar10 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                  (&((this->super_XMLScanner).fAttrList)->
                                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar15);
              pXVar7 = pXVar10->fAttName->fLocalPart;
              if (pXVar7 != pXVar8) {
                pXVar13 = pXVar8;
                if ((pXVar8 != (XMLCh *)0x0) && (pXVar7 != (XMLCh *)0x0)) {
                  do {
                    XVar5 = *pXVar7;
                    if (XVar5 == L'\0') goto LAB_002c1b53;
                    pXVar7 = pXVar7 + 1;
                    XVar1 = *pXVar13;
                    pXVar13 = pXVar13 + 1;
                  } while (XVar5 == XVar1);
                  goto LAB_002c1b5e;
                }
                if (pXVar7 == (XMLCh *)0x0) {
                  if (pXVar8 == (XMLCh *)0x0) goto LAB_002c1b6c;
LAB_002c1b53:
                  bVar4 = *pXVar13 == L'\0';
                }
                else {
                  bVar4 = *pXVar7 == L'\0';
                  if ((pXVar8 != (XMLCh *)0x0) && (*pXVar7 == L'\0')) goto LAB_002c1b53;
                }
                if (!bVar4) goto LAB_002c1b5e;
              }
LAB_002c1b6c:
              XMLScanner::emitError
                        (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar8,local_80,(XMLCh *)0x0,
                         (XMLCh *)0x0);
              break;
            }
LAB_002c1b5e:
            XVar15 = XVar15 + 1;
          } while (XVar15 != uVar6);
        }
        ReaderMgr::skipPastSpaces(this_00);
        bVar4 = scanAttValue(this,pXVar8,local_38);
        if (!bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
          XVar5 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
          if (((XVar5 != L'/') && (XVar5 != L'>')) &&
             (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                         [(ushort)XVar5])) {
            iVar16 = 1;
            toFill = local_78;
            if (XVar5 == L'<') {
              XMLScanner::emitError
                        (&this->super_XMLScanner,UnterminatedStartTag,local_80,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
              toFill = local_78;
            }
            goto LAB_002c1d39;
          }
        }
        if (uVar6 < local_40) {
          pXVar10 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                              (&((this->super_XMLScanner).fAttrList)->
                                super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,uVar6);
          pXVar7 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
          pXVar7[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
          QName::setName(pXVar10->fAttName,L"",pXVar8,0);
          XMLAttr::setValue(pXVar10,pXVar7);
          pXVar10->fType = AttTypes_Min;
          pXVar10->fSpecified = true;
          ValueVectorOf<unsigned_long>::setElementAt(this->fAttrNameHashList,&attNameHash,uVar6);
        }
        else {
          pXVar10 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
          pXVar7 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
          pXVar7[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
          XMLAttr::XMLAttr(pXVar10,0,pXVar8,L"",pXVar7,AttTypes_Min,true,
                           (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,false);
          this_03 = &((this->super_XMLScanner).fAttrList)->
                     super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
          BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_03,1);
          XVar15 = this_03->fCurCount;
          this_03->fElemList[XVar15] = pXVar10;
          this_03->fCurCount = XVar15 + 1;
          this_04 = this->fAttrNameHashList;
          ValueVectorOf<unsigned_long>::ensureExtraCapacity(this_04,1);
          XVar15 = this_04->fCurCount;
          this_04->fCurCount = XVar15 + 1;
          this_04->fElemList[XVar15] = attNameHash;
        }
        uVar6 = uVar6 + 1;
        toFill = local_78;
LAB_002c1d33:
        iVar16 = 2;
      }
      else {
        iVar16 = 0;
        if ((ushort)XVar5 < 0x2f) {
          if ((XVar5 == L'\"') || (XVar5 == L'\'')) {
            XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
            ReaderMgr::getNextChar(this_00);
            ReaderMgr::skipQuotedString(this_00,XVar5);
            ReaderMgr::skipPastSpaces(this_00);
            goto LAB_002c1d33;
          }
          if (XVar5 == L'\0') {
            this_06 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
            UnexpectedEOFException::UnexpectedEOFException
                      (this_06,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                       ,0x3d8,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
            __cxa_throw(this_06,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
          }
        }
        else if (XVar5 == L'/') {
          ReaderMgr::getNextChar(this_00);
          bVar4 = ReaderMgr::skippedChar(this_00,L'>');
          local_70 = CONCAT71((int7)((ulong)pXVar11 >> 8),1);
          iVar16 = 3;
          if (!bVar4) {
            XMLScanner::emitError
                      (&this->super_XMLScanner,UnterminatedStartTag,local_80,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          if (XVar5 == L'<') {
            pXVar8 = QName::getRawName((local_60->super_XMLElementDecl).fElementName);
            XMLScanner::emitError
                      (&this->super_XMLScanner,UnterminatedStartTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0
                       ,(XMLCh *)0x0);
          }
          else {
            if (XVar5 != L'>') goto LAB_002c1d39;
            ReaderMgr::getNextChar(this_00);
          }
          iVar16 = 3;
        }
      }
LAB_002c1d39:
      XVar15 = local_48;
    } while ((iVar16 == 0) || (iVar16 == 2));
    if (iVar16 == 3) {
      if (((local_70 & 1) != 0) && (ElemStack::popTop(local_50), XVar15 == 0)) {
        *local_58 = false;
      }
      pXVar3 = (this->super_XMLScanner).fDocHandler;
      if (pXVar3 != (XMLDocumentHandler *)0x0) {
        (*pXVar3->_vptr_XMLDocumentHandler[0xb])
                  (pXVar3,local_60,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                   (this->super_XMLScanner).fAttrList,uVar6,(ulong)((byte)local_70 & 1),
                   (ulong)(XVar15 == 0));
        return true;
      }
      return true;
    }
  }
  else {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    do {
      XVar5 = ReaderMgr::getNextChar(this_00);
      if (XVar5 == L'\0') {
        return false;
      }
    } while (XVar5 != L'<');
  }
  return false;
}

Assistant:

bool WFXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fElementLookup->get(qnameRawBuf);

    if (!elemDecl) {

        if (fElementIndex < fElements->size()) {
            elemDecl = fElements->elementAt(fElementIndex);
        }
        else {
            elemDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
            (
                fGrammarPoolMemoryManager
            );
            fElements->addElement(elemDecl);
        }

        elemDecl->setElementName(XMLUni::fgZeroLenString, qnameRawBuf, fEmptyNamespaceId);
        fElementLookup->put((void*)elemDecl->getFullName(), elemDecl);
        fElementIndex++;
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared more than one for this element.
            const XMLCh* attNameRawBuf = fAttNameBuf.getRawBuffer();
            XMLSize_t attNameHash = XMLString::hash(attNameRawBuf, 109);

            if (attCount) {

                for (XMLSize_t k=0; k < attCount; k++) {

                    if (fAttrNameHashList->elementAt(k) == attNameHash) {
                        if (
                               XMLString::equals
                               (
                                   fAttrList->elementAt(k)->getName()
                                   , attNameRawBuf
                               )
                           )
                        {
                            emitError
                            (
                                XMLErrs::AttrAlreadyUsedInSTag
                                , attNameRawBuf
                                , qnameRawBuf
                            );
                            break;
                        }
                    }
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attNameRawBuf, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                    , XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
                fAttrNameHashList->addElement(attNameHash);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                );
                curAtt->setSpecified(true);
                fAttrNameHashList->setElementAt(attNameHash, attCount);
            }
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}